

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

BasicBlock * __thiscall
FlowGraph::InsertAirlockBlock(FlowGraph *this,FlowEdge *edge,bool afterForward)

{
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  uint uVar1;
  BasicBlock *block;
  Type pSVar2;
  Type pFVar3;
  Func *func;
  code *pcVar4;
  bool bVar5;
  BasicBlock *blockSucc;
  long lVar6;
  undefined4 *puVar7;
  Type *ppFVar8;
  BasicBlock *pBVar9;
  LabelInstr *pLVar10;
  BranchInstr *pBVar11;
  LabelInstr *this_01;
  BranchInstr *pBVar12;
  MultiBranchInstr *this_02;
  FlowEdge *edge_00;
  BasicBlock *pBVar13;
  Func **ppFVar14;
  long lVar15;
  Instr *local_58;
  
  blockSucc = BasicBlock::New(this);
  pBVar13 = edge->predBlock;
  block = edge->succBlock;
  pBVar9 = pBVar13->next;
  ppFVar14 = (Func **)&pBVar9->firstInstr;
  if (pBVar9 == (BasicBlock *)0x0) {
    ppFVar14 = &pBVar13->func;
  }
  lVar15 = 0x18;
  lVar6 = lVar15;
  if (pBVar9 == (BasicBlock *)0x0) {
    lVar6 = 0xd0;
  }
  local_58 = *(Instr **)((long)&(*ppFVar14)->m_alloc + lVar6);
  if (local_58->m_kind != InstrKindBranch) {
    this_00 = &pBVar13->succList;
    pSVar2 = (pBVar13->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2 == this_00) ||
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2->next != this_00)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x87e,"(successors->HasOne())",
                         "Failed to normalize weird block before airlock");
      if (!bVar5) goto LAB_003fd20a;
      *puVar7 = 0;
    }
    ppFVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head
                        (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
    pFVar3 = *ppFVar8;
    if (pFVar3 != edge) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x880,"(onlyLink == edge)","Found duplicate of edge?");
      if (!bVar5) goto LAB_003fd20a;
      *puVar7 = 0;
    }
    pBVar9 = pFVar3->succBlock;
    if (pBVar9 != block) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x881,"(onlyLink->GetSucc() == sinkBlock)","State inconsistent");
      if (!bVar5) goto LAB_003fd20a;
      *puVar7 = 0;
      pBVar9 = pFVar3->succBlock;
    }
    pLVar10 = IR::Instr::AsLabelInstr(pBVar9->firstInstr);
    pBVar11 = IR::BranchInstr::New(Br,pLVar10,local_58->m_func);
    IR::Instr::InsertAfter(local_58,&pBVar11->super_Instr);
    local_58 = local_58->m_next;
  }
  pBVar9 = block->prev;
  ppFVar14 = (Func **)&pBVar9->next->firstInstr;
  if (pBVar9->next == (BasicBlock *)0x0) {
    lVar15 = 0xd0;
    ppFVar14 = &pBVar9->func;
  }
  pBVar11 = *(BranchInstr **)((long)&(*ppFVar14)->m_alloc + lVar15);
  blockSucc->loop = block->loop;
  uVar1 = this->blockCount;
  this->blockCount = uVar1 + 1;
  blockSucc->number = uVar1;
  blockSucc->field_0x19 = blockSucc->field_0x19 | 2;
  blockSucc->prev = block->prev;
  block->prev = blockSucc;
  blockSucc->next = block;
  blockSucc->prev->next = blockSucc;
  BasicBlock::RemoveSucc(pBVar13,block,this,false,false);
  AddEdge(this,pBVar13,blockSucc);
  edge->predBlock = blockSucc;
  BasicBlock::AddSucc(blockSucc,edge,this);
  blockSucc->dataUseCount = 1;
  BasicBlock::DecrementDataUseCount(pBVar13);
  pLVar10 = IR::Instr::AsLabelInstr(block->firstInstr);
  func = (pLVar10->super_Instr).m_func;
  this_01 = IR::LabelInstr::New(Label,func,false);
  IR::Instr::InsertAfter(&pBVar11->super_Instr,&this_01->super_Instr);
  blockSucc->firstInstr = &this_01->super_Instr;
  IR::LabelInstr::SetBasicBlock(this_01,blockSucc);
  pBVar12 = IR::BranchInstr::New(Br,pLVar10,func);
  IR::Instr::SetByteCodeOffset(&pBVar12->super_Instr,&pLVar10->super_Instr);
  IR::Instr::InsertAfter(&this_01->super_Instr,&pBVar12->super_Instr);
  IR::Instr::SetByteCodeOffset(&this_01->super_Instr,&pLVar10->super_Instr);
  if (afterForward) {
    this_01->m_region = pLVar10->m_region;
  }
  pBVar12 = IR::Instr::AsBranchInstr(local_58);
  bVar5 = IR::BranchInstr::IsMultiBranch(pBVar12);
  if (bVar5) {
    this_02 = IR::BranchInstr::AsMultiBrInstr(pBVar12);
    bVar5 = IR::MultiBranchInstr::ReplaceTarget(this_02,pLVar10,this_01);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x8cd,"(replaced)","replaced");
      if (!bVar5) {
LAB_003fd20a:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
  }
  else if (pBVar12->m_branchTarget == pLVar10) {
    IR::BranchInstr::SetTarget(pBVar12,this_01);
  }
  if ((pBVar11->super_Instr).m_kind == InstrKindBranch) {
    pBVar11 = IR::Instr::AsBranchInstr(&pBVar11->super_Instr);
    bVar5 = IR::Instr::HasFallThrough(&pBVar11->super_Instr);
    if (!bVar5) goto LAB_003fd1e6;
  }
  if (((pBVar9->field_0x18 & 1) == 0) &&
     (edge_00 = FindEdge((FlowGraph *)pBVar11,pBVar9,block), edge_00 != (FlowEdge *)0x0)) {
    pBVar13 = InsertCompensationCodeForBlockMove(this,edge_00,true,true,afterForward);
    pBVar13->dataUseCount = pBVar13->dataUseCount + 1;
    pBVar13->field_0x18 = pBVar13->field_0x18 | 0x40;
  }
LAB_003fd1e6:
  Dump(this,true,L"\n After insertion of airlock block \n");
  return blockSucc;
}

Assistant:

BasicBlock *
FlowGraph::InsertAirlockBlock(FlowEdge * edge, bool afterForward /*= false*/)
{
    BasicBlock * airlockBlock = BasicBlock::New(this);
    BasicBlock * sourceBlock = edge->GetPred();
    BasicBlock * sinkBlock = edge->GetSucc();

    IR::Instr * sourceLastInstr = sourceBlock->GetLastInstr();

    //
    // Normalize block
    //
    if(!sourceLastInstr->IsBranchInstr())
    {
        // There are some cases where the last instruction of a block can be not a branch;
        // for example, if it was previously a conditional branch that was impossible to take.
        // In these situations, we can insert an unconditional branch to fallthrough for that
        // block, to renormalize it.
        SListBaseCounted<FlowEdge*>* successors = sourceBlock->GetSuccList();
        // Only handling the case for one arc left at the moment; other cases are likely bugs.
        AssertOrFailFastMsg(successors->HasOne(), "Failed to normalize weird block before airlock");
        FlowEdge* onlyLink = successors->Head();
        AssertOrFailFastMsg(onlyLink == edge, "Found duplicate of edge?");
        AssertOrFailFastMsg(onlyLink->GetSucc() == sinkBlock, "State inconsistent");
        sourceLastInstr->InsertAfter(IR::BranchInstr::New(Js::OpCode::Br, onlyLink->GetSucc()->GetFirstInstr()->AsLabelInstr(), sourceLastInstr->m_func));
        sourceLastInstr = sourceLastInstr->m_next;
    }

    BasicBlock * sinkPrevBlock = sinkBlock->prev;
    IR::Instr *  sinkPrevBlockLastInstr = sinkPrevBlock->GetLastInstr();

    airlockBlock->loop = sinkBlock->loop;
    airlockBlock->SetBlockNum(this->blockCount++);
#ifdef DBG
    airlockBlock->isAirLockBlock = true;
#endif

    //
    // Fixup block linkage
    //

    // airlock block is inserted right before sourceBlock
    airlockBlock->prev = sinkBlock->prev;
    sinkBlock->prev = airlockBlock;

    airlockBlock->next = sinkBlock;
    airlockBlock->prev->next = airlockBlock;

    //
    // Fixup flow edges
    //

    sourceBlock->RemoveSucc(sinkBlock, this, false);

    // Add sourceBlock -> airlockBlock
    this->AddEdge(sourceBlock, airlockBlock);

    // Add airlockBlock -> sinkBlock
    edge->SetPred(airlockBlock);
    airlockBlock->AddSucc(edge, this);

    // Fixup data use count
    airlockBlock->SetDataUseCount(1);
    sourceBlock->DecrementDataUseCount();

    //
    // Fixup IR
    //

    // Maintain the instruction region for inlining
    IR::LabelInstr *sinkLabel = sinkBlock->GetFirstInstr()->AsLabelInstr();
    Func * sinkLabelFunc = sinkLabel->m_func;

    IR::LabelInstr *airlockLabel = IR::LabelInstr::New(Js::OpCode::Label, sinkLabelFunc);

    sinkPrevBlockLastInstr->InsertAfter(airlockLabel);

    airlockBlock->SetFirstInstr(airlockLabel);
    airlockLabel->SetBasicBlock(airlockBlock);

    // Add br to sinkBlock from airlock block
    IR::BranchInstr *airlockBr = IR::BranchInstr::New(Js::OpCode::Br, sinkLabel, sinkLabelFunc);
    airlockBr->SetByteCodeOffset(sinkLabel);
    airlockLabel->InsertAfter(airlockBr);
    airlockBlock->SetLastInstr(airlockBr);

    airlockLabel->SetByteCodeOffset(sinkLabel);

    // If we have regions in play, we should update them on the airlock block appropriately
    if (afterForward)
    {
        airlockLabel->SetRegion(sinkLabel->GetRegion());
    }

    // Fixup flow out of sourceBlock
    IR::BranchInstr *sourceBr = sourceLastInstr->AsBranchInstr();
    if (sourceBr->IsMultiBranch())
    {
        const bool replaced = sourceBr->AsMultiBrInstr()->ReplaceTarget(sinkLabel, airlockLabel);
        Assert(replaced);
    }
    else if (sourceBr->GetTarget() == sinkLabel)
    {
        sourceBr->SetTarget(airlockLabel);
    }

    if (!sinkPrevBlockLastInstr->IsBranchInstr() || sinkPrevBlockLastInstr->AsBranchInstr()->HasFallThrough())
    {
        if (!sinkPrevBlock->isDeleted)
        {
            FlowEdge *dstEdge = this->FindEdge(sinkPrevBlock, sinkBlock);
            if (dstEdge) // Possibility that sourceblock may be same as sinkPrevBlock
            {
                BasicBlock* compensationBlock = this->InsertCompensationCodeForBlockMove(dstEdge, true /*insert comp block to loop list*/, true, afterForward);
                compensationBlock->IncrementDataUseCount();
                // We need to skip airlock compensation block in globopt as its inserted while globopt is iteration over the blocks.
                compensationBlock->isAirLockCompensationBlock = true;
            }
        }
    }

#if DBG_DUMP
    this->Dump(true, _u("\n After insertion of airlock block \n"));
#endif

    return airlockBlock;
}